

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_F26Dot6 Round_Up_To_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  ulong uVar1;
  undefined8 local_28;
  FT_F26Dot6 val;
  FT_F26Dot6 compensation_local;
  FT_F26Dot6 distance_local;
  TT_ExecContext exc_local;
  
  if (distance < 0) {
    uVar1 = (compensation - distance) + 0x3fU & 0xffffffffffffffc0;
    local_28 = -uVar1;
    if ((long)uVar1 < 0) {
      local_28 = 0;
    }
  }
  else {
    local_28 = distance + compensation + 0x3fU & 0xffffffffffffffc0;
    if ((long)local_28 < 0) {
      local_28 = 0;
    }
  }
  return local_28;
}

Assistant:

static FT_F26Dot6
  Round_Up_To_Grid( TT_ExecContext  exc,
                    FT_F26Dot6      distance,
                    FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;

    FT_UNUSED( exc );


    if ( distance >= 0 )
    {
      val = FT_PIX_CEIL_LONG( ADD_LONG( distance, compensation ) );
      if ( val < 0 )
        val = 0;
    }
    else
    {
      val = NEG_LONG( FT_PIX_CEIL_LONG( SUB_LONG( compensation,
                                                  distance ) ) );
      if ( val > 0 )
        val = 0;
    }

    return val;
  }